

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.hpp
# Opt level: O0

value_ptr pstore::dump::make_value<pstore::repo::fragment>(extent<pstore::repo::fragment> ex)

{
  initializer_list<pstore::dump::object::member> __l;
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  typed_address<pstore::repo::fragment> __r;
  value_ptr vVar1;
  member *local_188;
  allocator<pstore::dump::object::member> local_14a;
  undefined1 local_149;
  value_ptr local_148;
  allocator local_131;
  string local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  value_ptr local_108 [2];
  allocator local_e1;
  string local_e0;
  member *local_c0;
  member local_b8;
  member local_88;
  iterator local_58;
  size_type local_50;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_48;
  undefined1 local_30 [8];
  shared_ptr<pstore::dump::object> v;
  extent<pstore::repo::fragment> ex_local;
  
  v.super___shared_ptr<pstore::dump::object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ex.size;
  __r = ex.addr.a_.a_;
  local_149 = 1;
  local_c0 = &local_b8;
  ex_local.size = (uint64_t)__r.a_.a_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"addr",&local_e1);
  local_110 = v.super___shared_ptr<pstore::dump::object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  make_value<pstore::repo::fragment>
            ((dump *)local_108,
             (typed_address<pstore::repo::fragment>)
             v.super___shared_ptr<pstore::dump::object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  object::member::member(&local_b8,&local_e0,local_108);
  local_c0 = &local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"size",&local_131);
  make_value((dump *)&local_148,(uint64_t *)&ex_local);
  object::member::member(&local_88,&local_130,&local_148);
  local_149 = 0;
  local_58 = &local_b8;
  local_50 = 2;
  std::allocator<pstore::dump::object::member>::allocator(&local_14a);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_48,__l,&local_14a);
  std::
  make_shared<pstore::dump::object,std::vector<pstore::dump::object::member,std::allocator<pstore::dump::object::member>>>
            ((vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> *)
             local_30);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_48);
  std::allocator<pstore::dump::object::member>::~allocator(&local_14a);
  local_188 = (member *)&local_58;
  do {
    local_188 = local_188 + -1;
    object::member::~member(local_188);
  } while (local_188 != &local_b8);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_148);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(local_108);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  this = std::__shared_ptr_access<pstore::dump::object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<pstore::dump::object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_30);
  object::compact(this,true);
  std::static_pointer_cast<pstore::dump::value,pstore::dump::object>
            ((shared_ptr<pstore::dump::object> *)__r.a_.a_);
  std::shared_ptr<pstore::dump::object>::~shared_ptr((shared_ptr<pstore::dump::object> *)local_30);
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__r.a_.a_;
  return (value_ptr)vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (extent<T> ex) {
            auto const v = std::make_shared<object> (object::container{
                {"addr", make_value (ex.addr)},
                {"size", make_value (ex.size)},
            });
            v->compact ();
            return std::static_pointer_cast<value> (v);
        }